

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexIdent_Test::~LexerTest_LexIdent_Test(LexerTest_LexIdent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, LexIdent) {
  EXPECT_EQ(Lexer("$09azAZ!#$%&'*+-./:<=>?@\\^_`|~"sv).takeID(),
            wasm::Name("09azAZ!#$%&'*+-./:<=>?@\\^_`|~"sv));
  EXPECT_FALSE(Lexer("$[]{}"sv).takeID());
  EXPECT_FALSE(Lexer("$abc[]"sv).takeID());
  EXPECT_FALSE(Lexer("$"sv).takeID());

  // String IDs
  EXPECT_EQ(Lexer("$\"\""sv).takeID(), wasm::Name(""sv));
  EXPECT_EQ(Lexer("$\"hello\""sv).takeID(), wasm::Name("hello"sv));
  // _$_£_€_𐍈_
  EXPECT_EQ(Lexer("$\"_\\u{24}_\\u{00a3}_\\u{20AC}_\\u{10348}_\""sv).takeID(),
            wasm::Name("_$_\xC2\xA3_\xE2\x82\xAC_\xF0\x90\x8D\x88_"sv));
}